

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# communication.c
# Opt level: O2

int decode(uchar *src,int len,uchar *dst,int buf_max)

{
  byte bVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  int iVar8;
  
  uVar6 = 0;
  uVar5 = (ulong)(uint)len;
  if (len < 1) {
    uVar5 = uVar6;
  }
  uVar3 = 0;
  uVar7 = 0;
  iVar8 = 0;
  iVar4 = 0;
  iVar2 = 0;
  do {
    if (uVar5 == uVar6) {
      iVar8 = -iVar2;
      if (iVar2 == 0) {
        iVar8 = iVar4;
      }
      return iVar8;
    }
    bVar1 = src[uVar6];
    if (bVar1 >= 0x40) {
      uVar7 = bVar1 - 0x40;
    }
    iVar2 = iVar2 + (uint)(bVar1 < 0x40);
    uVar3 = (uVar7 & 0xffff) << (10U - (char)iVar8 & 0x1f) | uVar3;
    if (iVar8 < 2) {
      iVar8 = iVar8 + 6;
    }
    else {
      dst[iVar4] = (uchar)(uVar3 >> 8);
      iVar4 = iVar4 + 1;
      if (buf_max <= iVar4) {
        return 0;
      }
      iVar8 = iVar8 + -2;
      uVar3 = (uVar3 & 0xffff) << 8;
    }
    uVar6 = uVar6 + 1;
  } while( true );
}

Assistant:

int decode(const unsigned char* src, int len, unsigned char* dst, int buf_max)
{
  unsigned short dat, b;
  int pos, s_pos, w_pos;
  int rerr;
  pos = 0;    // read position
  w_pos = 0;  // write_position
  s_pos = 0;  // shift position
  rerr = 0;
  dat = 0;
  b = 0;
  while (pos < len)
  {
    if (src[pos] >= 0x40)
      b = src[pos] - 0x40;
    else
      rerr++;

    dat |= (b << (10 - s_pos));
    s_pos += 6;
    if (s_pos >= 8)
    {
      dst[w_pos] = (dat >> 8);
      w_pos++;
      if (w_pos >= buf_max)
        return 0;
      s_pos -= 8;
      dat = dat << 8;
    }
    pos++;
  }

  if (rerr)
    return -rerr;
  return w_pos;
}